

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  Vec_Que_t *pVVar4;
  float *pfVar5;
  Vec_Int_t *pVVar6;
  void *__ptr;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  Fx_Man_t *p;
  long lVar11;
  int *piVar12;
  uint uVar13;
  abctime aVar14;
  int *extraout_RDX;
  int *fWarning;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  timespec local_50;
  int local_40;
  int local_3c;
  long local_38;
  
  local_40 = fVerbose;
  local_3c = nNewNodesMax;
  iVar9 = clock_gettime(3,&local_50);
  if (iVar9 < 0) {
    local_38 = -1;
  }
  else {
    local_38 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p = Fx_ManStart(vCubes);
  p->LitCountMax = LitCountMax;
  p->fCanonDivs = fCanonDivs;
  Fx_ManCreateLiterals(p,ObjIdMax);
  Fx_ManComputeLevel(p);
  Fx_ManCreateDivisors(p);
  if ((fVeryVerbose != 0) && (0 < p->vWeights->nSize)) {
    iVar9 = 0;
    do {
      Fx_PrintDiv(p,iVar9);
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->vWeights->nSize);
  }
  iVar9 = local_3c;
  if (local_40 != 0) {
    iVar10 = clock_gettime(3,&local_50);
    if (iVar10 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar16 - local_38);
  }
  iVar10 = clock_gettime(3,&local_50);
  if (iVar10 < 0) {
    aVar14 = -1;
  }
  else {
    aVar14 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeStart = aVar14;
  if (0 < iVar9) {
    iVar10 = 0;
    do {
      pVVar4 = p->vPrio;
      iVar3 = pVVar4->nSize;
      if (iVar3 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      fVar21 = -1e+09;
      if (iVar3 != 1) {
        if (*pVVar4->pCostsFlt == (float *)0x0) {
          fVar21 = (float)pVVar4->pHeap[1];
        }
        else {
          fVar21 = (*pVVar4->pCostsFlt)[pVVar4->pHeap[1]];
        }
      }
      if (fVar21 <= 0.0) break;
      if (iVar3 == 1) {
        __assert_fail("p->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xed,"int Vec_QuePop(Vec_Que_t *)");
      }
      piVar12 = pVVar4->pHeap;
      fWarning = pVVar4->pOrder;
      iVar3 = piVar12[1];
      fWarning[iVar3] = -1;
      iVar17 = pVVar4->nSize;
      pVVar4->nSize = iVar17 + -1;
      if (iVar17 + -1 == 1) {
        piVar12[1] = -1;
      }
      else {
        iVar9 = piVar12[(long)iVar17 + -1];
        piVar12[(long)iVar17 + -1] = -1;
        piVar12[1] = iVar9;
        fWarning[iVar9] = 1;
        pfVar5 = *pVVar4->pCostsFlt;
        if (pfVar5 == (float *)0x0) {
          fVar21 = (float)iVar9;
        }
        else {
          fVar21 = pfVar5[iVar9];
        }
        iVar17 = pVVar4->nSize;
        uVar15 = 1;
        if (2 < iVar17) {
          uVar13 = 2;
          uVar15 = 1;
          do {
            uVar18 = uVar13 | 1;
            uVar19 = uVar13;
            if ((int)uVar18 < iVar17) {
              if (pfVar5 == (float *)0x0) {
                fVar22 = (float)piVar12[(int)uVar13];
              }
              else {
                fVar22 = pfVar5[piVar12[(int)uVar13]];
              }
              if (pfVar5 == (float *)0x0) {
                fVar23 = (float)piVar12[(int)uVar18];
              }
              else {
                fVar23 = pfVar5[piVar12[(int)uVar18]];
              }
              if (fVar22 < fVar23) {
                uVar19 = uVar18;
              }
            }
            if (iVar17 <= (int)uVar19) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar17 = piVar12[(int)uVar19];
            if (pfVar5 == (float *)0x0) {
              fVar22 = (float)iVar17;
            }
            else {
              fVar22 = pfVar5[iVar17];
            }
            if (fVar22 <= fVar21) break;
            piVar12[(int)uVar15] = iVar17;
            fWarning[iVar17] = uVar15;
            uVar13 = uVar19 * 2;
            iVar17 = pVVar4->nSize;
            uVar15 = uVar19;
          } while ((int)uVar13 < iVar17);
        }
        piVar12[(int)uVar15] = iVar9;
        fWarning[iVar9] = uVar15;
        iVar9 = local_3c;
      }
      if (fVeryVerbose != 0) {
        Fx_PrintDiv(p,iVar3);
        fWarning = extraout_RDX;
      }
      Fx_ManUpdate(p,iVar3,fWarning);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar9);
  }
  if (local_40 != 0) {
    iVar9 = clock_gettime(3,&local_50);
    if (iVar9 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar16 - local_38);
  }
  Fx_ManStop(p);
  if (vCubes->nSize < 1) {
    uVar15 = 0;
  }
  else {
    lVar16 = 0;
    lVar20 = 8;
    uVar15 = 0;
    do {
      pVVar6 = vCubes->pArray;
      if (*(int *)((long)pVVar6 + lVar20 + -4) < 1) {
        __ptr = *(void **)((long)&pVVar6->nCap + lVar20);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar6->nCap + lVar20) = 0;
        }
      }
      else {
        puVar1 = (undefined4 *)((long)&pVVar6->nCap + lVar20);
        lVar11 = (long)(int)uVar15;
        uVar15 = uVar15 + 1;
        iVar9 = puVar1[-1];
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        pVVar6 = pVVar6 + lVar11;
        pVVar6->nCap = puVar1[-2];
        pVVar6->nSize = iVar9;
        *(undefined4 *)&pVVar6->pArray = uVar7;
        *(undefined4 *)((long)&pVVar6->pArray + 4) = uVar8;
      }
      lVar16 = lVar16 + 1;
      lVar20 = lVar20 + 0x10;
    } while (lVar16 < vCubes->nSize);
  }
  iVar9 = vCubes->nSize;
  if ((int)uVar15 < iVar9) {
    if ((int)uVar15 < 0) goto LAB_002c7854;
    lVar16 = (ulong)uVar15 << 4;
    uVar13 = uVar15;
    do {
      puVar2 = (undefined8 *)((long)&vCubes->pArray->nCap + lVar16);
      *puVar2 = 0;
      puVar2[1] = 0;
      iVar9 = vCubes->nSize;
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0x10;
    } while ((int)uVar13 < iVar9);
  }
  if ((int)uVar15 < iVar9) {
    if ((int)uVar15 < 0) {
LAB_002c7854:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    piVar12 = &vCubes->pArray[uVar15].nSize;
    uVar13 = uVar15;
    do {
      if (*piVar12 < 0) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      *piVar12 = 0;
      uVar13 = uVar13 + 1;
      piVar12 = piVar12 + 4;
    } while ((int)uVar13 < iVar9);
  }
  if (iVar9 < (int)uVar15) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0xff,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = uVar15;
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintDivisors( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintDivisors( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}